

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Line.cpp
# Opt level: O0

void __thiscall
Serial::Line<false>::write_internal<false,unsigned_short>
          (Line<false> *this,HalfCycles cycles,int count,unsigned_short levels)

{
  ushort uVar1;
  Type TVar2;
  IntType IVar3;
  size_type sVar4;
  reference pvVar5;
  int top_bit;
  unsigned_short bit;
  size_type event;
  unsigned_short levels_local;
  int count_local;
  Line<false> *this_local;
  HalfCycles cycles_local;
  
  this_local = (Line<false> *)cycles.super_WrappedInt<HalfCycles>.length_;
  IVar3 = WrappedInt<HalfCycles>::as_integral((WrappedInt<HalfCycles> *)&this_local);
  this->remaining_delays_ = count * IVar3 + this->remaining_delays_;
  _top_bit = std::vector<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>::
             size(&this->events_);
  sVar4 = std::vector<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>::size
                    (&this->events_);
  std::vector<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>::resize
            (&this->events_,sVar4 + (long)count * 2);
  event._2_2_ = levels;
  event._4_4_ = count;
  while (event._4_4_ != 0) {
    pvVar5 = std::vector<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>::
             operator[](&this->events_,_top_bit);
    pvVar5->type = Delay;
    IVar3 = WrappedInt<HalfCycles>::as_integral((WrappedInt<HalfCycles> *)&this_local);
    pvVar5 = std::vector<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>::
             operator[](&this->events_,_top_bit);
    pvVar5->delay = (int)IVar3;
    uVar1 = event._2_2_ & 0x8000;
    event._2_2_ = event._2_2_ << 1;
    TVar2 = SetLow;
    if (uVar1 != 0) {
      TVar2 = SetHigh;
    }
    pvVar5 = std::vector<Serial::Line<false>::Event,_std::allocator<Serial::Line<false>::Event>_>::
             operator[](&this->events_,_top_bit + 1);
    pvVar5->type = TVar2;
    _top_bit = _top_bit + 2;
    event._4_4_ = event._4_4_ + -1;
  }
  return;
}

Assistant:

void Line<include_clock>::write_internal(HalfCycles cycles, int count, IntT levels) {
	remaining_delays_ += count * cycles.as_integral();

	auto event = events_.size();
	events_.resize(events_.size() + size_t(count)*2);
	while(count--) {
		events_[event].type = Event::Delay;
		events_[event].delay = int(cycles.as_integral());
		IntT bit;
		if constexpr (lsb_first) {
			bit = levels & 1;
			levels >>= 1;
		} else {
			constexpr auto top_bit = IntT(0x80) << ((sizeof(IntT) - 1) * 8);
			bit = levels & top_bit;
			levels <<= 1;
		}

		events_[event+1].type = bit ? Event::SetHigh : Event::SetLow;
		event += 2;
	}
}